

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::CommandLineInterface::EncodeOrDecode
          (CommandLineInterface *this,DescriptorPool *pool)

{
  char cVar1;
  long lVar2;
  long *plVar3;
  ZeroCopyInputStream *pZVar4;
  ostream *poVar5;
  bool bVar6;
  char *pcVar7;
  ErrorPrinter error_collector;
  Parser parser;
  DynamicMessageFactory dynamic_factory;
  FileOutputStream out;
  FileInputStream in;
  undefined **local_138;
  undefined *local_130;
  ErrorFormat local_128;
  undefined4 uStack_124;
  undefined8 local_120;
  ErrorCollector *local_118 [3];
  undefined1 local_100;
  DynamicMessageFactory local_f8 [40];
  FileOutputStream local_d0 [80];
  FileInputStream local_80 [88];
  
  lVar2 = google::protobuf::DescriptorPool::FindMessageTypeByName((string *)pool);
  if (lVar2 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Type not defined: ",0x12);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(this->codec_type_)._M_dataplus._M_p,
                        (this->codec_type_)._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    return false;
  }
  google::protobuf::DynamicMessageFactory::DynamicMessageFactory(local_f8,pool);
  plVar3 = (long *)google::protobuf::DynamicMessageFactory::GetPrototype((Descriptor *)local_f8);
  pZVar4 = (ZeroCopyInputStream *)(**(code **)(*plVar3 + 0x18))(plVar3);
  google::protobuf::io::FileInputStream::FileInputStream(local_80,0,-1);
  google::protobuf::io::FileOutputStream::FileOutputStream(local_d0,1,-1);
  if (this->mode_ == MODE_ENCODE) {
    local_128 = this->error_format_;
    local_138 = &PTR__ErrorPrinter_0019a9a0;
    local_130 = &DAT_0019a9d0;
    local_120 = 0;
    google::protobuf::TextFormat::Parser::Parser((Parser *)local_118);
    local_100 = 1;
    local_118[0] = (ErrorCollector *)&local_130;
    cVar1 = google::protobuf::TextFormat::Parser::Parse
                      ((ZeroCopyInputStream *)local_118,(Message *)local_80);
    if (cVar1 != '\0') {
      google::protobuf::TextFormat::Parser::~Parser((Parser *)local_118);
      google::protobuf::io::ErrorCollector::~ErrorCollector((ErrorCollector *)&local_130);
      google::protobuf::compiler::MultiFileErrorCollector::~MultiFileErrorCollector
                ((MultiFileErrorCollector *)&local_138);
LAB_00136d7c:
      if (pZVar4 == (ZeroCopyInputStream *)0x0) {
LAB_00136ec6:
        __assert_fail("ptr_ != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/stubs/common.h"
                      ,0x1e3,
                      "C *google::protobuf::internal::scoped_ptr<google::protobuf::Message>::operator->() const [C = google::protobuf::Message]"
                     );
      }
      cVar1 = (**(code **)(*(long *)pZVar4 + 0x28))(pZVar4);
      if (cVar1 == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"warning:  Input message is missing required fields:  ",
                   0x35);
        (**(code **)(*(long *)pZVar4 + 0x30))(&local_138,pZVar4);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(char *)local_138,(long)local_130);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        if (local_138 != (undefined **)&local_128) {
          operator_delete(local_138,CONCAT44(uStack_124,local_128) + 1);
        }
      }
      if (this->mode_ == MODE_ENCODE) {
        cVar1 = google::protobuf::MessageLite::SerializePartialToZeroCopyStream
                          ((ZeroCopyOutputStream *)pZVar4);
      }
      else {
        cVar1 = google::protobuf::TextFormat::Print
                          ((Message *)pZVar4,(ZeroCopyOutputStream *)local_d0);
      }
      bVar6 = true;
      if (cVar1 != '\0') goto LAB_00136e85;
      lVar2 = 0x12;
      pcVar7 = "output: I/O error.";
      goto LAB_00136e49;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Failed to parse input.",0x16);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    google::protobuf::TextFormat::Parser::~Parser((Parser *)local_118);
    google::protobuf::io::ErrorCollector::~ErrorCollector((ErrorCollector *)&local_130);
    google::protobuf::compiler::MultiFileErrorCollector::~MultiFileErrorCollector
              ((MultiFileErrorCollector *)&local_138);
  }
  else {
    if (pZVar4 == (ZeroCopyInputStream *)0x0) goto LAB_00136ec6;
    cVar1 = google::protobuf::MessageLite::ParsePartialFromZeroCopyStream(pZVar4);
    if (cVar1 != '\0') goto LAB_00136d7c;
    lVar2 = 0x16;
    pcVar7 = "Failed to parse input.";
LAB_00136e49:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar7,lVar2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
  }
  bVar6 = false;
LAB_00136e85:
  google::protobuf::io::FileOutputStream::~FileOutputStream(local_d0);
  google::protobuf::io::FileInputStream::~FileInputStream(local_80);
  if (pZVar4 != (ZeroCopyInputStream *)0x0) {
    (**(code **)(*(long *)pZVar4 + 8))(pZVar4);
  }
  google::protobuf::DynamicMessageFactory::~DynamicMessageFactory(local_f8);
  return bVar6;
}

Assistant:

bool CommandLineInterface::EncodeOrDecode(const DescriptorPool* pool) {
  // Look up the type.
  const Descriptor* type = pool->FindMessageTypeByName(codec_type_);
  if (type == NULL) {
    cerr << "Type not defined: " << codec_type_ << endl;
    return false;
  }

  DynamicMessageFactory dynamic_factory(pool);
  scoped_ptr<Message> message(dynamic_factory.GetPrototype(type)->New());

  if (mode_ == MODE_ENCODE) {
    SetFdToTextMode(STDIN_FILENO);
    SetFdToBinaryMode(STDOUT_FILENO);
  } else {
    SetFdToBinaryMode(STDIN_FILENO);
    SetFdToTextMode(STDOUT_FILENO);
  }

  io::FileInputStream in(STDIN_FILENO);
  io::FileOutputStream out(STDOUT_FILENO);

  if (mode_ == MODE_ENCODE) {
    // Input is text.
    ErrorPrinter error_collector(error_format_);
    TextFormat::Parser parser;
    parser.RecordErrorsTo(&error_collector);
    parser.AllowPartialMessage(true);

    if (!parser.Parse(&in, message.get())) {
      cerr << "Failed to parse input." << endl;
      return false;
    }
  } else {
    // Input is binary.
    if (!message->ParsePartialFromZeroCopyStream(&in)) {
      cerr << "Failed to parse input." << endl;
      return false;
    }
  }

  if (!message->IsInitialized()) {
    cerr << "warning:  Input message is missing required fields:  "
         << message->InitializationErrorString() << endl;
  }

  if (mode_ == MODE_ENCODE) {
    // Output is binary.
    if (!message->SerializePartialToZeroCopyStream(&out)) {
      cerr << "output: I/O error." << endl;
      return false;
    }
  } else {
    // Output is text.
    if (!TextFormat::Print(*message, &out)) {
      cerr << "output: I/O error." << endl;
      return false;
    }
  }

  return true;
}